

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O0

void __thiscall kj::GzipInputStream::GzipInputStream(GzipInputStream *this,InputStream *inner)

{
  bool bVar1;
  Fault local_58;
  Fault f;
  int local_40;
  DebugExpression<int> local_3c;
  undefined1 local_38 [8];
  DebugComparison<int,_int> _kjCondition;
  InputStream *inner_local;
  GzipInputStream *this_local;
  
  _kjCondition._24_8_ = inner;
  InputStream::InputStream(&this->super_InputStream);
  (this->super_InputStream)._vptr_InputStream = (_func_int **)&PTR__GzipInputStream_00c16bb8;
  this->inner = (InputStream *)_kjCondition._24_8_;
  (this->ctx).next_in = (Bytef *)0x0;
  (this->ctx).avail_in = 0;
  (this->ctx).total_in = 0;
  (this->ctx).next_out = (Bytef *)0x0;
  (this->ctx).avail_out = 0;
  (this->ctx).total_out = 0;
  (this->ctx).msg = (char *)0x0;
  (this->ctx).state = (internal_state *)0x0;
  (this->ctx).zalloc = (alloc_func)0x0;
  (this->ctx).zfree = (free_func)0x0;
  (this->ctx).opaque = (voidpf)0x0;
  (this->ctx).data_type = 0;
  (this->ctx).adler = 0;
  (this->ctx).reserved = 0;
  this->atValidEndpoint = false;
  local_40 = inflateInit2_(&this->ctx,0x1f,"1.2.11",0x70);
  local_3c = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_40);
  f.exception._0_4_ = 0;
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_38,&local_3c,(int *)&f)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
               ,0x5a,FAILED,"inflateInit2(&ctx, 15 + 16) == Z_OK","_kjCondition,",
               (DebugComparison<int,_int> *)local_38);
    kj::_::Debug::Fault::fatal(&local_58);
  }
  return;
}

Assistant:

GzipInputStream::GzipInputStream(InputStream& inner)
    : inner(inner) {
  // windowBits = 15 (maximum) + magic value 16 to ask for gzip.
  KJ_ASSERT(inflateInit2(&ctx, 15 + 16) == Z_OK);
}